

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

Var __thiscall Js::JavascriptProxy::ToString(JavascriptProxy *this,ScriptContext *scriptContext)

{
  bool bVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  RecyclableObject **ppRVar3;
  ThreadContext *threadContext;
  ScriptContext *scriptContext_local;
  JavascriptProxy *this_local;
  
  bVar1 = IsRevoked(this);
  if (bVar1) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_00 = ScriptContext::GetThreadContext(pSVar2);
    bVar1 = ThreadContext::RecordImplicitException(this_00);
    if (bVar1) {
      pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea15,L"toString");
    }
    this_local = (JavascriptProxy *)0x0;
  }
  else {
    ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->target);
    this_local = (JavascriptProxy *)JavascriptObject::ToStringHelper(*ppRVar3,scriptContext);
  }
  return this_local;
}

Assistant:

Var JavascriptProxy::ToString(ScriptContext* scriptContext)
    {
        //RecyclableObject* targetObj;
        if (IsRevoked())
        {
            ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return nullptr;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("toString"));
        }
        return JavascriptObject::ToStringHelper(target, scriptContext);
    }